

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_internal_wrap.cpp
# Opt level: O0

hrgls_Status
hrgls_DataBlobSourceGetNextBlob(hrgls_DataBlobSource stream,hrgls_DataBlob *blob,timeval timeout)

{
  DataBlob returnBlob;
  hrgls_DataBlob blobToCopy;
  timeval timeout_00;
  hrgls_Status s;
  DataBlobSource local_38;
  DataBlob f;
  hrgls_DataBlob *blob_local;
  hrgls_DataBlobSource stream_local;
  timeval timeout_local;
  
  timeout_00.tv_usec = timeout.tv_sec;
  if (stream == (hrgls_DataBlobSource)0x0) {
    timeout_local.tv_usec._4_4_ = 0x3ee;
  }
  else if (blob == (hrgls_DataBlob *)0x0) {
    timeout_local.tv_usec._4_4_ = 0x3e9;
  }
  else {
    timeout_00.tv_sec = (__time_t)stream->stream;
    f.m_private = (DataBlob_private *)blob;
    hrgls::datablob::DataBlobSource::GetNextBlob(&local_38,timeout_00);
    returnBlob.m_private = f.m_private;
    blobToCopy = hrgls::datablob::DataBlob::RawDataBlob((DataBlob *)&local_38);
    timeout_local.tv_usec._4_4_ = hrgls_DataBlobCopy(&(returnBlob.m_private)->blob,blobToCopy);
    if (timeout_local.tv_usec._4_4_ == 0) {
      timeout_local.tv_usec._4_4_ = hrgls::datablob::DataBlobSource::GetStatus(stream->stream);
    }
    hrgls::datablob::DataBlob::~DataBlob((DataBlob *)&local_38);
  }
  return timeout_local.tv_usec._4_4_;
}

Assistant:

hrgls_Status hrgls_DataBlobSourceGetNextBlob(hrgls_DataBlobSource stream,
    hrgls_DataBlob * blob, struct timeval timeout)
  {
    if (!stream) {
      return hrgls_STATUS_NULL_OBJECT_POINTER;
    }
    if (!blob) {
      return hrgls_STATUS_BAD_PARAMETER;
    }
    try {
      hrgls::datablob::DataBlob f = stream->stream->GetNextBlob(timeout);
      hrgls_Status s = hrgls_DataBlobCopy(blob, f.RawDataBlob());
      if (s != hrgls_STATUS_OKAY) {
        return s;
      }
      return stream->stream->GetStatus();
    }
    catch (...) {
      return hrgls_STATUS_INTERNAL_EXCEPTION;
    }
  }